

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

parasail_matrix_t *
parasail_matrix_convert_square_to_pssm(parasail_matrix_t *matrix,char *s1,int s1Len)

{
  int iVar1;
  int *__src;
  int *piVar2;
  parasail_matrix_t *ppVar3;
  int *__dest;
  int *piVar4;
  long lVar5;
  char *__dest_00;
  char *__dest_01;
  ulong uVar6;
  size_t _size;
  size_t __size;
  int *__dest_02;
  
  if (matrix->type == 0) {
    iVar1 = matrix->size;
    ppVar3 = (parasail_matrix_t *)malloc(0x48);
    if (ppVar3 == (parasail_matrix_t *)0x0) {
      parasail_matrix_convert_square_to_pssm_cold_3();
    }
    else {
      __dest = (int *)malloc(0x400);
      if (__dest != (int *)0x0) {
        __src = matrix->mapper;
        memcpy(__dest,__src,0x400);
        __size = (long)(iVar1 * s1Len) << 2;
        piVar4 = (int *)malloc(__size);
        if (piVar4 != (int *)0x0) {
          lVar5 = (long)iVar1;
          __size = lVar5 + 1;
          __dest_00 = (char *)malloc(__size);
          if (__dest_00 != (char *)0x0) {
            memcpy(__dest_00,matrix->alphabet,__size);
            __size = (size_t)(s1Len + 1);
            __dest_01 = (char *)malloc(__size);
            if (__dest_01 != (char *)0x0) {
              memcpy(__dest_01,s1,__size);
              if (0 < s1Len) {
                piVar2 = matrix->matrix;
                uVar6 = 0;
                __dest_02 = piVar4;
                do {
                  memcpy(__dest_02,piVar2 + __src[(byte)s1[uVar6]] * lVar5,lVar5 * 4);
                  uVar6 = uVar6 + 1;
                  __dest_02 = __dest_02 + lVar5;
                } while ((uint)s1Len != uVar6);
              }
              ppVar3->name = matrix->name;
              ppVar3->matrix = piVar4;
              ppVar3->mapper = __dest;
              ppVar3->size = iVar1;
              iVar1 = matrix->min;
              ppVar3->max = matrix->max;
              ppVar3->min = iVar1;
              ppVar3->user_matrix = piVar4;
              ppVar3->type = 1;
              ppVar3->length = s1Len;
              ppVar3->alphabet = __dest_00;
              ppVar3->query = __dest_01;
              return ppVar3;
            }
          }
        }
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_convert_square_to_pssm",
                __size);
        return (parasail_matrix_t *)0x0;
      }
      parasail_matrix_convert_square_to_pssm_cold_2();
    }
  }
  else {
    parasail_matrix_convert_square_to_pssm_cold_1();
  }
  return (parasail_matrix_t *)0x0;
}

Assistant:

parasail_matrix_t* parasail_matrix_convert_square_to_pssm(
        const parasail_matrix_t *matrix,
        const char *s1,
        int s1Len)
{
    parasail_matrix_t *retval = NULL;
    size_t matrix_size = matrix->size*s1Len;
    size_t alphabet_size = matrix->size+1;
    int *new_mapper = NULL;
    int *new_matrix = NULL;
    char *new_alphabet = NULL;
    char *new_query = NULL;
    int i;

    PARASAIL_CHECK_NULL(matrix);

    if (matrix->type != PARASAIL_MATRIX_TYPE_SQUARE) {
        fprintf(stderr, "%s: attempted to convert non-square matrix to pssm\n", __func__);
        return NULL;
    }

    PARASAIL_NEW(retval, parasail_matrix_t);

    PARASAIL_CALLOC(new_mapper, int, 256);
    (void)memcpy(new_mapper, matrix->mapper, sizeof(int)*256);

    PARASAIL_CALLOC(new_matrix, int, matrix_size);

    PARASAIL_CALLOC(new_alphabet, char, alphabet_size);
    (void)memcpy(new_alphabet, matrix->alphabet, sizeof(char)*alphabet_size);

    PARASAIL_CALLOC(new_query, char, s1Len+1);
    (void)memcpy(new_query, s1, sizeof(char)*(s1Len+1));

    for (i=0; i<s1Len; ++i) {
        (void)memcpy(
                &new_matrix[matrix->size*i],
                &matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[i]]],
                sizeof(int)*matrix->size);
    }

    retval->name = matrix->name;
    retval->matrix = new_matrix;
    retval->mapper = new_mapper;
    retval->size = matrix->size;
    retval->max = matrix->max;
    retval->min = matrix->min;
    retval->user_matrix = new_matrix;
    retval->type = PARASAIL_MATRIX_TYPE_PSSM;
    retval->length = s1Len;
    retval->alphabet = new_alphabet;
    retval->query = new_query;

    return retval;
}